

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::SolveSOR
          (TPZSkylMatrix<std::complex<long_double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<long_double>_> *F,TPZFMatrix<std::complex<long_double>_> *result,
          TPZFMatrix<std::complex<long_double>_> *residual,
          TPZFMatrix<std::complex<long_double>_> *scratch,REAL overrelax,REAL *tol,int FromCurrent,
          int direction)

{
  double dVar1;
  complex<long_double> **ppcVar2;
  complex<long_double> *pcVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  undefined4 extraout_var;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  complex<long_double> *pcVar13;
  long lVar14;
  complex<long_double> *pcVar15;
  long lVar16;
  undefined *puVar17;
  undefined8 *puVar18;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble lVar19;
  longdouble lVar20;
  longdouble in_ST2;
  longdouble lVar21;
  longdouble lVar22;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  complex<long_double> val;
  complex<long_double> __r;
  complex<long_double> __r_2;
  complex<long_double> over;
  long local_1c0;
  longdouble local_1b8;
  complex<long_double> local_188;
  TPZSkylMatrix<std::complex<long_double>_> *local_160;
  complex<long_double> local_158;
  long local_138;
  double local_130;
  longdouble local_128;
  long local_118;
  int local_10c;
  undefined4 local_108;
  undefined2 local_104;
  long local_100;
  complex<long_double> local_f8;
  double *local_d8;
  TPZFMatrix<std::complex<long_double>_> *local_d0;
  long *local_c8;
  long local_c0;
  int64_t local_b8;
  long local_b0;
  TPZFMatrix<std::complex<long_double>_> *local_a8;
  long local_a0;
  complex<long_double> *local_98;
  long local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  REAL local_68;
  double local_60;
  complex<long_double> local_58;
  
  local_160 = this;
  local_d0 = F;
  local_c8 = numiterations;
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  local_10c = direction;
  local_d8 = tol;
  local_a8 = residual;
  if (residual == (TPZFMatrix<std::complex<long_double>_> *)0x0) {
    dVar1 = *tol + *tol + 1.0;
  }
  else {
    Dot<std::complex<long_double>>(&local_188,residual,residual);
    sqrtl();
    dVar1 = (double)in_ST0;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    local_60 = dVar1;
  }
  local_1b8 = (longdouble)CONCAT28(local_1b8._8_2_,dVar1);
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  local_58._M_value._0_8_ = SUB108((longdouble)overrelax,0);
  local_58._M_value._8_2_ = SUB102((unkuint10)(longdouble)overrelax >> 0x40,0);
  local_58._M_value._16_8_ = SUB108((longdouble)0,0);
  local_58._M_value._24_2_ = SUB102((unkuint10)(longdouble)0 >> 0x40,0);
  local_68 = overrelax;
  iVar8 = (*(local_160->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable[0xc])();
  local_118 = CONCAT44(extraout_var,iVar8) + -1;
  lVar16 = 0;
  local_138 = lVar16;
  if (local_10c != -1) {
    local_118 = lVar16;
    local_138 = CONCAT44(extraout_var,iVar8);
  }
  if ((0 < *local_c8) && (*local_d8 <= dVar1 && dVar1 != *local_d8)) {
    local_b8 = (local_d0->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
    local_100 = (ulong)(local_10c != -1) * 2 + -1;
    local_a0 = local_118 * 0x20 + 0x30;
    local_90 = local_100 * 0x20;
    lVar16 = 0;
    do {
      local_c0 = lVar16;
      TPZFMatrix<std::complex<long_double>_>::operator=(scratch,local_d0);
      local_130 = 0.0;
      if (0 < local_b8) {
        local_130 = 0.0;
        local_b0 = 0;
        local_1c0 = 0;
        do {
          if (local_10c == 1) {
            local_1b8 = (longdouble)CONCAT28(local_1b8._8_2_,local_a0);
            lVar16 = local_118;
            if (local_118 != local_138) {
              do {
                ppcVar2 = (local_160->fElem).fStore;
                lVar12 = (long)ppcVar2[lVar16 + 1] - (long)ppcVar2[lVar16] >> 5;
                lVar19 = (longdouble)0;
                local_188._M_value._0_4_ = SUB104(lVar19,0);
                local_188._M_value._4_4_ = SUB104((unkuint10)lVar19 >> 0x20,0);
                local_188._M_value._8_2_ = SUB102((unkuint10)lVar19 >> 0x40,0);
                local_128 = (longdouble)CONCAT28(local_128._8_2_,lVar12);
                local_188._M_value._16_4_ = local_188._M_value._0_4_;
                local_188._M_value._20_4_ = local_188._M_value._4_4_;
                local_188._M_value._24_2_ = local_188._M_value._8_2_;
                if (((lVar16 - lVar12 < -1) ||
                    (lVar10 = (scratch->super_TPZMatrix<std::complex<long_double>_>).
                              super_TPZBaseMatrix.fRow, lVar10 <= (lVar16 - lVar12) + 1)) ||
                   ((scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= local_1c0)) {
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if (((lVar16 < 0) ||
                    (lVar9 = (result->super_TPZMatrix<std::complex<long_double>_>).
                             super_TPZBaseMatrix.fRow, lVar9 <= lVar16)) ||
                   ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= local_1c0)) {
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar9 = lVar9 * local_1c0;
                pcVar3 = result->fElem + lVar9 + lVar16;
                uVar4 = *(undefined8 *)pcVar3->_M_value;
                uVar5 = *(undefined8 *)(pcVar3->_M_value + 8);
                puVar18 = (undefined8 *)(result->fElem[lVar9 + lVar16]._M_value + 0x10);
                uVar6 = *puVar18;
                uVar7 = puVar18[1];
                local_188._M_value._16_4_ = SUB84(uVar6,0);
                local_188._M_value._20_4_ = SUB84((ulong)uVar6 >> 0x20,0);
                local_188._M_value._24_2_ = SUB82(uVar7,0);
                local_188._M_value._26_2_ = SUB82((ulong)uVar7 >> 0x10,0);
                local_188._M_value._28_2_ = SUB82((ulong)uVar7 >> 0x20,0);
                local_188._M_value._30_2_ = SUB82((ulong)uVar7 >> 0x30,0);
                local_188._M_value._0_4_ = SUB84(uVar4,0);
                local_188._M_value._4_4_ = SUB84((ulong)uVar4 >> 0x20,0);
                local_188._M_value._8_2_ = SUB82(uVar5,0);
                local_188._M_value._10_2_ = SUB82((ulong)uVar5 >> 0x10,0);
                local_188._M_value._12_2_ = SUB82((ulong)uVar5 >> 0x20,0);
                local_188._M_value._14_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                puVar18 = (undefined8 *)
                          ((long)(local_160->fElem).fStore[lVar16] +
                          ((long)ppcVar2[lVar16 + 1] - (long)ppcVar2[lVar16]) + -0x20);
                lVar9 = (long)puVar18 - (long)ppcVar2[lVar16] >> 5;
                if (-1 < lVar9) {
                  lVar9 = lVar9 + 1;
                  lVar12 = lVar10 * local_b0 + lVar12 * -0x20;
                  puVar17 = scratch->fElem->_M_value + local_1b8._0_8_;
                  do {
                    uVar4 = *puVar18;
                    uVar5 = puVar18[1];
                    local_158._M_value._16_8_ = puVar18[2];
                    uVar6 = puVar18[3];
                    local_158._M_value._24_2_ = SUB82(uVar6,0);
                    local_158._M_value._26_4_ = SUB84((ulong)uVar6 >> 0x10,0);
                    local_158._M_value._30_2_ = SUB82((ulong)uVar6 >> 0x30,0);
                    local_158._M_value._0_4_ = SUB84(uVar4,0);
                    local_158._M_value._4_2_ = SUB82((ulong)uVar4 >> 0x20,0);
                    local_158._M_value._6_2_ = SUB82((ulong)uVar4 >> 0x30,0);
                    local_158._M_value._8_2_ = SUB82(uVar5,0);
                    local_158._M_value._10_4_ = SUB84((ulong)uVar5 >> 0x10,0);
                    local_158._M_value._14_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                    std::complex<long_double>::operator*=(&local_158,&local_188);
                    *(longdouble *)(puVar17 + lVar12 + -0x10) =
                         *(longdouble *)(puVar17 + lVar12 + -0x10) -
                         (longdouble)
                         CONCAT28(local_158._M_value._8_2_,
                                  CONCAT26(local_158._M_value._6_2_,
                                           CONCAT24(local_158._M_value._4_2_,
                                                    local_158._M_value._0_4_)));
                    *(longdouble *)(puVar17 + lVar12) =
                         *(longdouble *)(puVar17 + lVar12) -
                         (longdouble)CONCAT28(local_158._M_value._24_2_,local_158._M_value._16_8_);
                    puVar17 = puVar17 + 0x20;
                    puVar18 = puVar18 + -4;
                    lVar9 = lVar9 + -1;
                  } while (lVar9 != 0);
                }
                lVar16 = lVar16 + local_100;
                local_1b8 = (longdouble)CONCAT28(local_1b8._8_2_,local_1b8._0_8_ + local_90);
              } while (lVar16 != local_138);
              lVar16 = local_118;
              if (local_118 != local_138) {
                do {
                  ppcVar2 = (local_160->fElem).fStore;
                  lVar12 = (long)ppcVar2[lVar16 + 1] - (long)ppcVar2[lVar16];
                  if (((lVar16 < 0) ||
                      (lVar10 = (scratch->super_TPZMatrix<std::complex<long_double>_>).
                                super_TPZBaseMatrix.fRow, lVar10 <= lVar16)) ||
                     ((scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                      fCol <= local_1c0)) {
                    TPZFMatrix<std::complex<long_double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  lVar10 = lVar10 * local_1c0;
                  lVar9 = lVar12 >> 5;
                  pcVar3 = scratch->fElem + lVar10 + lVar16;
                  uVar4 = *(undefined8 *)pcVar3->_M_value;
                  uVar5 = *(undefined8 *)(pcVar3->_M_value + 8);
                  local_1b8 = (longdouble)CONCAT28(local_1b8._8_2_,lVar16 * 0x20);
                  puVar18 = (undefined8 *)(scratch->fElem[lVar10 + lVar16]._M_value + 0x10);
                  local_158._M_value._16_8_ = *puVar18;
                  uVar6 = puVar18[1];
                  local_158._M_value._24_2_ = SUB82(uVar6,0);
                  local_158._M_value._26_4_ = SUB84((ulong)uVar6 >> 0x10,0);
                  local_158._M_value._30_2_ = SUB82((ulong)uVar6 >> 0x30,0);
                  local_158._M_value._0_4_ = SUB84(uVar4,0);
                  local_158._M_value._4_2_ = SUB82((ulong)uVar4 >> 0x20,0);
                  local_158._M_value._6_2_ = SUB82((ulong)uVar4 >> 0x30,0);
                  local_158._M_value._8_2_ = SUB82(uVar5,0);
                  local_158._M_value._10_4_ = SUB84((ulong)uVar5 >> 0x10,0);
                  local_158._M_value._14_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                  lVar10 = (lVar16 - lVar9) + 1;
                  if (((lVar16 - lVar9 < -1) ||
                      (lVar9 = (result->super_TPZMatrix<std::complex<long_double>_>).
                               super_TPZBaseMatrix.fRow, lVar9 <= lVar10)) ||
                     ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                      <= local_1c0)) {
                    TPZFMatrix<std::complex<long_double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  pcVar3 = (local_160->fElem).fStore[lVar16];
                  pcVar13 = (complex<long_double> *)((long)pcVar3 + lVar12 + -0x20);
                  lVar19 = in_ST0;
                  lVar21 = in_ST1;
                  lVar20 = in_ST2;
                  if (pcVar3 < pcVar13) {
                    pcVar15 = result->fElem + lVar9 * local_1c0 + lVar10;
                    do {
                      uVar4 = *(undefined8 *)(pcVar13->_M_value + 8);
                      uVar5 = *(undefined8 *)(pcVar13->_M_value + 0x18);
                      local_188._M_value._16_4_ = SUB84(*(undefined8 *)(pcVar13->_M_value + 0x10),0)
                      ;
                      local_188._M_value._20_4_ =
                           SUB84((ulong)*(undefined8 *)(pcVar13->_M_value + 0x10) >> 0x20,0);
                      local_188._M_value._24_2_ = SUB82(uVar5,0);
                      local_188._M_value._26_2_ = SUB82((ulong)uVar5 >> 0x10,0);
                      local_188._M_value._28_2_ = SUB82((ulong)uVar5 >> 0x20,0);
                      local_188._M_value._30_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                      local_188._M_value._0_4_ = SUB84(*(undefined8 *)pcVar13->_M_value,0);
                      local_188._M_value._4_4_ =
                           SUB84((ulong)*(undefined8 *)pcVar13->_M_value >> 0x20,0);
                      local_188._M_value._8_2_ = SUB82(uVar4,0);
                      local_188._M_value._10_2_ = SUB82((ulong)uVar4 >> 0x10,0);
                      local_188._M_value._12_2_ = SUB82((ulong)uVar4 >> 0x20,0);
                      local_188._M_value._14_2_ = SUB82((ulong)uVar4 >> 0x30,0);
                      std::complex<long_double>::operator*=(&local_188,pcVar15);
                      lVar21 = (longdouble)
                               CONCAT28(local_158._M_value._8_2_,
                                        CONCAT26(local_158._M_value._6_2_,
                                                 CONCAT24(local_158._M_value._4_2_,
                                                          local_158._M_value._0_4_))) -
                               (longdouble)
                               CONCAT28(local_188._M_value._8_2_,
                                        CONCAT44(local_188._M_value._4_4_,local_188._M_value._0_4_))
                      ;
                      lVar19 = (longdouble)
                               CONCAT28(local_158._M_value._24_2_,local_158._M_value._16_8_) -
                               (longdouble)
                               CONCAT28(local_188._M_value._24_2_,
                                        CONCAT44(local_188._M_value._20_4_,local_188._M_value._16_4_
                                                ));
                      local_158._M_value._0_4_ = SUB104(lVar21,0);
                      local_158._M_value._4_2_ = SUB102((unkuint10)lVar21 >> 0x20,0);
                      local_158._M_value._6_2_ = SUB102((unkuint10)lVar21 >> 0x30,0);
                      local_158._M_value._8_2_ = SUB102((unkuint10)lVar21 >> 0x40,0);
                      local_158._M_value._16_8_ = SUB108(lVar19,0);
                      local_158._M_value._24_2_ = SUB102((unkuint10)lVar19 >> 0x40,0);
                      pcVar13 = pcVar13 + -1;
                      pcVar15 = pcVar15 + 1;
                      lVar19 = in_ST0;
                      lVar21 = in_ST1;
                      lVar20 = in_ST2;
                    } while (pcVar3 < pcVar13);
                  }
                  in_ST1 = in_ST4;
                  in_ST0 = in_ST3;
                  local_f8._M_value._16_8_ = local_158._M_value._16_8_;
                  local_f8._M_value._24_2_ = local_158._M_value._24_2_;
                  local_f8._M_value._26_6_ =
                       SUB86(CONCAT26(local_158._M_value._30_2_,
                                      CONCAT42(local_158._M_value._26_4_,local_158._M_value._24_2_))
                             >> 0x10,0);
                  local_f8._M_value._0_4_ = local_158._M_value._0_4_;
                  local_f8._M_value._4_2_ = local_158._M_value._4_2_;
                  local_f8._M_value._6_2_ = local_158._M_value._6_2_;
                  local_f8._M_value._8_2_ = local_158._M_value._8_2_;
                  local_f8._M_value._10_6_ =
                       SUB86(CONCAT26(local_158._M_value._14_2_,
                                      CONCAT42(local_158._M_value._10_4_,local_158._M_value._8_2_))
                             >> 0x10,0);
                  std::complex<long_double>::operator*=(&local_f8,&local_158);
                  local_188._M_value._0_4_ = local_f8._M_value._0_4_;
                  local_188._M_value._4_4_ =
                       SUB84(CONCAT26(local_f8._M_value._6_2_,
                                      CONCAT24(local_f8._M_value._4_2_,local_f8._M_value._0_4_)) >>
                             0x20,0);
                  local_188._M_value._8_2_ = local_f8._M_value._8_2_;
                  local_188._M_value._16_4_ = local_f8._M_value._16_4_;
                  local_188._M_value._20_4_ = local_f8._M_value._20_4_;
                  local_188._M_value._24_2_ = local_f8._M_value._24_2_;
                  cabsl();
                  local_188._M_value._16_4_ = local_158._M_value._16_4_;
                  local_188._M_value._20_4_ = local_158._M_value._20_4_;
                  local_188._M_value._24_2_ = local_158._M_value._24_2_;
                  local_188._M_value._26_2_ = local_158._M_value._26_2_;
                  local_188._M_value._28_2_ = local_158._M_value._28_2_;
                  local_188._M_value._30_2_ = local_158._M_value._30_2_;
                  local_188._M_value._0_4_ = local_158._M_value._0_4_;
                  local_188._M_value._4_4_ =
                       SUB84(CONCAT26(local_158._M_value._6_2_,
                                      CONCAT24(local_158._M_value._4_2_,local_158._M_value._0_4_))
                             >> 0x20,0);
                  local_188._M_value._8_2_ = local_158._M_value._8_2_;
                  local_188._M_value._10_2_ = local_158._M_value._10_2_;
                  local_188._M_value._12_2_ = local_158._M_value._12_2_;
                  local_188._M_value._14_2_ = local_158._M_value._14_2_;
                  std::complex<long_double>::operator*=(&local_188,&local_58);
                  in_ST2 = in_ST1;
                  in_ST3 = in_ST1;
                  __divxc3();
                  local_80 = local_130;
                  local_130 = (double)(lVar19 + (longdouble)local_130);
                  local_88 = local_130;
                  if (((lVar16 < 0) ||
                      (lVar12 = (result->super_TPZMatrix<std::complex<long_double>_>).
                                super_TPZBaseMatrix.fRow, lVar12 <= lVar16)) ||
                     ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                      <= local_1c0)) {
                    TPZFMatrix<std::complex<long_double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  lVar12 = lVar12 * local_1c0;
                  pcVar3 = result->fElem;
                  lVar19 = *(longdouble *)(pcVar3[lVar12 + lVar16]._M_value + 0x10);
                  *(longdouble *)pcVar3[lVar12 + lVar16]._M_value =
                       lVar21 + *(longdouble *)pcVar3[lVar12 + lVar16]._M_value;
                  *(longdouble *)(pcVar3[lVar12 + lVar16]._M_value + 0x10) = lVar20 + lVar19;
                  lVar16 = lVar16 + local_100;
                  in_ST4 = in_ST3;
                } while (lVar16 != local_138);
              }
            }
          }
          else {
            lVar16 = local_118;
            if (local_118 != local_138) {
              do {
                ppcVar2 = (local_160->fElem).fStore;
                lVar12 = (long)ppcVar2[lVar16 + 1] - (long)ppcVar2[lVar16];
                if (((lVar16 < 0) ||
                    (lVar10 = (scratch->super_TPZMatrix<std::complex<long_double>_>).
                              super_TPZBaseMatrix.fRow, lVar10 <= lVar16)) ||
                   ((scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= local_1c0)) {
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar9 = lVar12 >> 5;
                lVar10 = lVar10 * local_1c0;
                pcVar3 = scratch->fElem;
                lVar19 = *(longdouble *)pcVar3[lVar10 + lVar16]._M_value;
                local_158._M_value._4_2_ = *(undefined2 *)(pcVar3[lVar10 + lVar16]._M_value + 0xe);
                local_158._M_value._0_4_ = *(undefined4 *)(pcVar3[lVar10 + lVar16]._M_value + 10);
                lVar21 = *(longdouble *)(pcVar3[lVar10 + lVar16]._M_value + 0x10);
                local_f8._M_value._4_2_ = *(undefined2 *)(pcVar3[lVar10 + lVar16]._M_value + 0x1e);
                local_f8._M_value._0_4_ = *(undefined4 *)(pcVar3[lVar10 + lVar16]._M_value + 0x1a);
                lVar10 = (lVar16 - lVar9) + 1;
                if (((lVar16 - lVar9 < -1) ||
                    (lVar9 = (result->super_TPZMatrix<std::complex<long_double>_>).
                             super_TPZBaseMatrix.fRow, lVar9 <= lVar10)) ||
                   ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= local_1c0)) {
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_128 = (longdouble)CONCAT28(local_128._8_2_,lVar16);
                pcVar3 = (local_160->fElem).fStore[lVar16];
                pcVar13 = (complex<long_double> *)((long)pcVar3 + lVar12 + -0x20);
                if (pcVar3 < pcVar13) {
                  pcVar15 = result->fElem + lVar9 * local_1c0 + lVar10;
                  do {
                    uVar4 = *(undefined8 *)(pcVar13->_M_value + 8);
                    uVar5 = *(undefined8 *)(pcVar13->_M_value + 0x18);
                    local_188._M_value._16_4_ = SUB84(*(undefined8 *)(pcVar13->_M_value + 0x10),0);
                    local_188._M_value._20_4_ =
                         SUB84((ulong)*(undefined8 *)(pcVar13->_M_value + 0x10) >> 0x20,0);
                    local_188._M_value._24_2_ = SUB82(uVar5,0);
                    local_188._M_value._26_2_ = SUB82((ulong)uVar5 >> 0x10,0);
                    local_188._M_value._28_2_ = SUB82((ulong)uVar5 >> 0x20,0);
                    local_188._M_value._30_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                    local_188._M_value._0_4_ = SUB84(*(undefined8 *)pcVar13->_M_value,0);
                    local_188._M_value._4_4_ =
                         SUB84((ulong)*(undefined8 *)pcVar13->_M_value >> 0x20,0);
                    local_188._M_value._8_2_ = SUB82(uVar4,0);
                    local_188._M_value._10_2_ = SUB82((ulong)uVar4 >> 0x10,0);
                    local_188._M_value._12_2_ = SUB82((ulong)uVar4 >> 0x20,0);
                    local_188._M_value._14_2_ = SUB82((ulong)uVar4 >> 0x30,0);
                    std::complex<long_double>::operator*=(&local_188,pcVar15);
                    lVar19 = lVar19 - (longdouble)
                                      CONCAT28(local_188._M_value._8_2_,
                                               CONCAT44(local_188._M_value._4_4_,
                                                        local_188._M_value._0_4_));
                    lVar21 = lVar21 - (longdouble)
                                      CONCAT28(local_188._M_value._24_2_,
                                               CONCAT44(local_188._M_value._20_4_,
                                                        local_188._M_value._16_4_));
                    pcVar13 = pcVar13 + -1;
                    pcVar15 = pcVar15 + 1;
                    local_1b8 = lVar21;
                  } while (pcVar3 < pcVar13);
                }
                if (((local_128._0_8_ < 0) ||
                    (lVar12 = (scratch->super_TPZMatrix<std::complex<long_double>_>).
                              super_TPZBaseMatrix.fRow, lVar12 <= local_128._0_8_)) ||
                   ((scratch->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                    <= local_1c0)) {
                  TPZFMatrix<std::complex<long_double>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar12 = lVar12 * local_1c0;
                pcVar3 = scratch->fElem;
                *(longdouble *)pcVar3[lVar12 + lVar16]._M_value = lVar19;
                *(undefined4 *)(pcVar3[lVar12 + lVar16]._M_value + 10) = local_158._M_value._0_4_;
                *(undefined2 *)(pcVar3[lVar12 + lVar16]._M_value + 0xe) = local_158._M_value._4_2_;
                *(longdouble *)(pcVar3[lVar12 + lVar16]._M_value + 0x10) = lVar21;
                *(undefined4 *)(pcVar3[lVar12 + lVar16]._M_value + 0x1a) = local_f8._M_value._0_4_;
                *(undefined2 *)(pcVar3[lVar12 + lVar16]._M_value + 0x1e) = local_f8._M_value._4_2_;
                lVar16 = local_128._0_8_ + local_100;
              } while (lVar16 != local_138);
              lVar16 = local_118;
              lVar19 = in_ST1;
              lVar21 = in_ST2;
              if (local_118 != local_138) {
                do {
                  in_ST1 = in_ST4;
                  ppcVar2 = (local_160->fElem).fStore;
                  pcVar3 = ppcVar2[lVar16];
                  lVar9 = (long)ppcVar2[lVar16 + 1] - (long)pcVar3;
                  lVar11 = lVar9 >> 5;
                  lVar14 = (lVar16 - lVar11) + 1;
                  lVar12 = (scratch->super_TPZMatrix<std::complex<long_double>_>).
                           super_TPZBaseMatrix.fRow;
                  lVar10 = (scratch->super_TPZMatrix<std::complex<long_double>_>).
                           super_TPZBaseMatrix.fCol;
                  if ((lVar10 <= local_1c0 || lVar16 - lVar11 < -1) || lVar12 <= lVar14) {
                    TPZFMatrix<std::complex<long_double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  pcVar13 = scratch->fElem;
                  lVar11 = lVar12 * local_1c0;
                  local_1b8 = (longdouble)CONCAT28(local_1b8._8_2_,lVar11);
                  if (((lVar16 < 0) || (lVar12 <= lVar16)) || (lVar10 <= local_1c0)) {
                    TPZFMatrix<std::complex<long_double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  uVar4 = *(undefined8 *)pcVar13[lVar11 + lVar16]._M_value;
                  uVar5 = *(undefined8 *)(pcVar13[lVar11 + lVar16]._M_value + 8);
                  local_158._M_value._16_8_ =
                       *(undefined8 *)(pcVar13[lVar11 + lVar16]._M_value + 0x10);
                  uVar6 = *(undefined8 *)((long)(pcVar13[lVar11 + lVar16]._M_value + 0x10) + 8);
                  local_158._M_value._24_2_ = SUB82(uVar6,0);
                  local_158._M_value._26_4_ = SUB84((ulong)uVar6 >> 0x10,0);
                  local_158._M_value._30_2_ = SUB82((ulong)uVar6 >> 0x30,0);
                  local_158._M_value._0_4_ = SUB84(uVar4,0);
                  local_158._M_value._4_2_ = SUB82((ulong)uVar4 >> 0x20,0);
                  local_158._M_value._6_2_ = SUB82((ulong)uVar4 >> 0x30,0);
                  local_158._M_value._8_2_ = SUB82(uVar5,0);
                  local_158._M_value._10_4_ = SUB84((ulong)uVar5 >> 0x10,0);
                  local_158._M_value._14_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                  local_98 = pcVar13;
                  if (((lVar16 < 0) ||
                      (lVar12 = (result->super_TPZMatrix<std::complex<long_double>_>).
                                super_TPZBaseMatrix.fRow, lVar12 <= lVar16)) ||
                     ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                      <= local_1c0)) {
                    TPZFMatrix<std::complex<long_double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  uVar4 = *(undefined8 *)(pcVar3->_M_value + 8);
                  uVar5 = *(undefined8 *)(pcVar3->_M_value + 0x18);
                  local_188._M_value._16_4_ = SUB84(*(undefined8 *)(pcVar3->_M_value + 0x10),0);
                  local_188._M_value._20_4_ =
                       SUB84((ulong)*(undefined8 *)(pcVar3->_M_value + 0x10) >> 0x20,0);
                  local_188._M_value._24_2_ = SUB82(uVar5,0);
                  local_188._M_value._26_2_ = SUB82((ulong)uVar5 >> 0x10,0);
                  local_188._M_value._28_2_ = SUB82((ulong)uVar5 >> 0x20,0);
                  local_188._M_value._30_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                  local_188._M_value._0_4_ = SUB84(*(undefined8 *)pcVar3->_M_value,0);
                  local_188._M_value._4_4_ = SUB84((ulong)*(undefined8 *)pcVar3->_M_value >> 0x20,0)
                  ;
                  local_188._M_value._8_2_ = SUB82(uVar4,0);
                  local_188._M_value._10_2_ = SUB82((ulong)uVar4 >> 0x10,0);
                  local_188._M_value._12_2_ = SUB82((ulong)uVar4 >> 0x20,0);
                  local_188._M_value._14_2_ = SUB82((ulong)uVar4 >> 0x30,0);
                  std::complex<long_double>::operator*=
                            (&local_188,result->fElem + lVar12 * local_1c0 + lVar16);
                  lVar22 = (longdouble)
                           CONCAT28(local_158._M_value._8_2_,
                                    CONCAT26(local_158._M_value._6_2_,
                                             CONCAT24(local_158._M_value._4_2_,
                                                      local_158._M_value._0_4_))) -
                           (longdouble)
                           CONCAT28(local_188._M_value._8_2_,
                                    CONCAT44(local_188._M_value._4_4_,local_188._M_value._0_4_));
                  lVar20 = (longdouble)CONCAT28(local_158._M_value._24_2_,local_158._M_value._16_8_)
                           - (longdouble)
                             CONCAT28(local_188._M_value._24_2_,
                                      CONCAT44(local_188._M_value._20_4_,local_188._M_value._16_4_))
                  ;
                  local_158._M_value._0_4_ = SUB104(lVar22,0);
                  local_158._M_value._4_2_ = SUB102((unkuint10)lVar22 >> 0x20,0);
                  local_158._M_value._6_2_ = SUB102((unkuint10)lVar22 >> 0x30,0);
                  local_158._M_value._8_2_ = SUB102((unkuint10)lVar22 >> 0x40,0);
                  local_158._M_value._16_8_ = SUB108(lVar20,0);
                  local_158._M_value._24_2_ = SUB102((unkuint10)lVar20 >> 0x40,0);
                  local_f8._M_value._16_8_ = local_158._M_value._16_8_;
                  local_f8._M_value._24_2_ = local_158._M_value._24_2_;
                  local_f8._M_value._26_6_ =
                       SUB86(CONCAT26(local_158._M_value._30_2_,
                                      CONCAT42(local_158._M_value._26_4_,local_158._M_value._24_2_))
                             >> 0x10,0);
                  local_f8._M_value._8_2_ = local_158._M_value._8_2_;
                  local_f8._M_value._10_6_ =
                       SUB86(CONCAT26(local_158._M_value._14_2_,
                                      CONCAT42(local_158._M_value._10_4_,local_158._M_value._8_2_))
                             >> 0x10,0);
                  local_f8._M_value._0_4_ = local_158._M_value._0_4_;
                  local_f8._M_value._4_2_ = local_158._M_value._4_2_;
                  local_f8._M_value._6_2_ = local_158._M_value._6_2_;
                  std::complex<long_double>::operator*=(&local_f8,&local_158);
                  local_188._M_value._0_4_ = local_f8._M_value._0_4_;
                  local_188._M_value._4_4_ =
                       SUB84(CONCAT26(local_f8._M_value._6_2_,
                                      CONCAT24(local_f8._M_value._4_2_,local_f8._M_value._0_4_)) >>
                             0x20,0);
                  local_188._M_value._8_2_ = local_f8._M_value._8_2_;
                  local_188._M_value._16_4_ = local_f8._M_value._16_4_;
                  local_188._M_value._20_4_ = local_f8._M_value._20_4_;
                  local_188._M_value._24_2_ = local_f8._M_value._24_2_;
                  cabsl();
                  local_188._M_value._16_4_ = local_58._M_value._16_4_;
                  local_188._M_value._20_4_ = local_58._M_value._20_4_;
                  local_188._M_value._24_2_ = local_58._M_value._24_2_;
                  local_188._M_value._26_2_ = local_58._M_value._26_2_;
                  local_188._M_value._28_2_ = local_58._M_value._28_2_;
                  local_188._M_value._30_2_ = local_58._M_value._30_2_;
                  local_188._M_value._0_4_ = local_58._M_value._0_4_;
                  local_188._M_value._4_4_ = local_58._M_value._4_4_;
                  local_188._M_value._8_2_ = local_58._M_value._8_2_;
                  local_188._M_value._10_2_ = local_58._M_value._10_2_;
                  local_188._M_value._12_2_ = local_58._M_value._12_2_;
                  local_188._M_value._14_2_ = local_58._M_value._14_2_;
                  local_128 = in_ST0;
                  std::complex<long_double>::operator*=(&local_188,&local_158);
                  local_f8._M_value._2_2_ = local_188._M_value._12_2_;
                  local_f8._M_value._0_2_ = local_188._M_value._10_2_;
                  local_f8._M_value._4_2_ = local_188._M_value._14_2_;
                  local_108._2_2_ = local_188._M_value._28_2_;
                  local_108._0_2_ = local_188._M_value._26_2_;
                  local_104 = local_188._M_value._30_2_;
                  in_ST0 = in_ST3;
                  in_ST2 = in_ST1;
                  in_ST3 = in_ST1;
                  in_ST4 = in_ST1;
                  __divxc3();
                  local_70 = local_130;
                  local_130 = (double)(local_128 + (longdouble)local_130);
                  local_158._M_value._0_4_ = SUB104(lVar19,0);
                  local_158._M_value._4_2_ = SUB102((unkuint10)lVar19 >> 0x20,0);
                  local_158._M_value._6_2_ = SUB102((unkuint10)lVar19 >> 0x30,0);
                  local_158._M_value._8_2_ = SUB102((unkuint10)lVar19 >> 0x40,0);
                  local_158._M_value._10_4_ = local_f8._M_value._0_4_;
                  local_158._M_value._14_2_ = local_f8._M_value._4_2_;
                  local_158._M_value._16_8_ = SUB108(lVar21,0);
                  local_158._M_value._24_2_ = SUB102((unkuint10)lVar21 >> 0x40,0);
                  local_158._M_value._26_4_ = local_108;
                  local_158._M_value._30_2_ = local_104;
                  local_78 = local_130;
                  if (((lVar16 < 0) ||
                      (lVar12 = (result->super_TPZMatrix<std::complex<long_double>_>).
                                super_TPZBaseMatrix.fRow, lVar12 <= lVar16)) ||
                     ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                      <= local_1c0)) {
                    TPZFMatrix<std::complex<long_double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  lVar12 = lVar12 * local_1c0;
                  pcVar13 = result->fElem;
                  lVar20 = *(longdouble *)(pcVar13[lVar12 + lVar16]._M_value + 0x10);
                  *(longdouble *)pcVar13[lVar12 + lVar16]._M_value =
                       *(longdouble *)pcVar13[lVar12 + lVar16]._M_value + lVar19;
                  *(longdouble *)(pcVar13[lVar12 + lVar16]._M_value + 0x10) = lVar20 + lVar21;
                  if (((lVar16 < 0) ||
                      (lVar12 = (result->super_TPZMatrix<std::complex<long_double>_>).
                                super_TPZBaseMatrix.fRow, lVar12 <= lVar16)) ||
                     ((result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                      <= local_1c0)) {
                    TPZFMatrix<std::complex<long_double>_>::Error
                              ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                    pzinternal::DebugStopImpl
                              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                               ,0x26d);
                  }
                  lVar12 = lVar12 * local_1c0;
                  pcVar13 = result->fElem + lVar12 + lVar16;
                  uVar4 = *(undefined8 *)pcVar13->_M_value;
                  uVar5 = *(undefined8 *)(pcVar13->_M_value + 8);
                  puVar18 = (undefined8 *)(result->fElem[lVar12 + lVar16]._M_value + 0x10);
                  local_158._M_value._16_8_ = *puVar18;
                  uVar6 = puVar18[1];
                  local_158._M_value._24_2_ = SUB82(uVar6,0);
                  local_158._M_value._26_4_ = SUB84((ulong)uVar6 >> 0x10,0);
                  local_158._M_value._30_2_ = SUB82((ulong)uVar6 >> 0x30,0);
                  local_158._M_value._0_4_ = SUB84(uVar4,0);
                  local_158._M_value._4_2_ = SUB82((ulong)uVar4 >> 0x20,0);
                  local_158._M_value._6_2_ = SUB82((ulong)uVar4 >> 0x30,0);
                  local_158._M_value._8_2_ = SUB82(uVar5,0);
                  local_158._M_value._10_4_ = SUB84((ulong)uVar5 >> 0x10,0);
                  local_158._M_value._14_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                  pcVar13 = (complex<long_double> *)
                            ((long)(local_160->fElem).fStore[lVar16] + lVar9 + -0x20);
                  if (pcVar3 < pcVar13) {
                    pcVar15 = local_98 + lVar11 + lVar14;
                    do {
                      uVar4 = *(undefined8 *)(pcVar13->_M_value + 8);
                      uVar5 = *(undefined8 *)(pcVar13->_M_value + 0x18);
                      local_188._M_value._16_4_ = SUB84(*(undefined8 *)(pcVar13->_M_value + 0x10),0)
                      ;
                      local_188._M_value._20_4_ =
                           SUB84((ulong)*(undefined8 *)(pcVar13->_M_value + 0x10) >> 0x20,0);
                      local_188._M_value._24_2_ = SUB82(uVar5,0);
                      local_188._M_value._26_2_ = SUB82((ulong)uVar5 >> 0x10,0);
                      local_188._M_value._28_2_ = SUB82((ulong)uVar5 >> 0x20,0);
                      local_188._M_value._30_2_ = SUB82((ulong)uVar5 >> 0x30,0);
                      local_188._M_value._0_4_ = SUB84(*(undefined8 *)pcVar13->_M_value,0);
                      local_188._M_value._4_4_ =
                           SUB84((ulong)*(undefined8 *)pcVar13->_M_value >> 0x20,0);
                      local_188._M_value._8_2_ = SUB82(uVar4,0);
                      local_188._M_value._10_2_ = SUB82((ulong)uVar4 >> 0x10,0);
                      local_188._M_value._12_2_ = SUB82((ulong)uVar4 >> 0x20,0);
                      local_188._M_value._14_2_ = SUB82((ulong)uVar4 >> 0x30,0);
                      std::complex<long_double>::operator*=(&local_188,&local_158);
                      lVar19 = *(longdouble *)(pcVar15->_M_value + 0x10);
                      *(longdouble *)pcVar15->_M_value =
                           *(longdouble *)pcVar15->_M_value -
                           (longdouble)
                           CONCAT28(local_188._M_value._8_2_,
                                    CONCAT44(local_188._M_value._4_4_,local_188._M_value._0_4_));
                      *(longdouble *)(pcVar15->_M_value + 0x10) =
                           lVar19 - (longdouble)
                                    CONCAT28(local_188._M_value._24_2_,
                                             CONCAT44(local_188._M_value._20_4_,
                                                      local_188._M_value._16_4_));
                      pcVar13 = pcVar13 + -1;
                      pcVar15 = pcVar15 + 1;
                    } while (pcVar3 < pcVar13);
                  }
                  lVar16 = lVar16 + local_100;
                  lVar19 = in_ST1;
                  lVar21 = in_ST2;
                } while (lVar16 != local_138);
              }
            }
          }
          local_1c0 = local_1c0 + 1;
          local_b0 = local_b0 + 0x20;
        } while (local_1c0 != local_b8);
      }
      if (local_130 < 0.0) {
        dVar1 = sqrt(local_130);
      }
      else {
        dVar1 = SQRT(local_130);
      }
      lVar16 = local_c0 + 1;
    } while ((lVar16 < *local_c8) && (*local_d8 <= dVar1 && dVar1 != *local_d8));
  }
  if (local_a8 != (TPZFMatrix<std::complex<long_double>_> *)0x0) {
    (*(local_160->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x28])(local_160,result,local_d0);
  }
  *local_c8 = lVar16;
  *local_d8 = dVar1;
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SolveSOR(int64_t & numiterations,const TPZFMatrix<TVar> &F,
                                   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch,const REAL overrelax,
                                   REAL &tol,const int FromCurrent,const int direction)  {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	REAL res = 2.*tol+1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
    TVar over = overrelax;
	int64_t r = this->Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	if(direction == -1) {
		ifirst = r-1;
		ilast = 0;
		iinc = -1;
	}
	int64_t it;
	for(it=0; it<numiterations && res > tol; it++) {
		res = 0.;
		scratch = F;
		for(int64_t ic=0; ic<c; ic++) {
			if(direction == 1) {
				//
				// compute the upper triangular part first and put into the scractch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val;
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					int64_t lastid = diag-diaglast;
					int64_t id;
					for(id=0; id<=lastid; id++) *(scratchp+id) -= *(diag-id) * val;
					/* codeguard fix
					 while( diag >= diaglast ) *scratchp++ -= *diag-- * val;
					 */
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					res += abs(val*val);
					result(i,ic) += val*over/ (*diag);
				}
			} else {
				//
				// the direction is upward
				//
				// put the lower triangular part of the multiplication into the scratch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					//					res += val*val;
					scratch(i,ic) = val;
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					//	TVar val = scratch(i,ic);
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					//val= result(i,ic);
					TVar val = scratch(i,ic);
					val -= *diaglast * result(i,ic);
					res += abs(val*val);
					val = over * val / *diaglast;
					result(i,ic) += val;
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					while( diag > diaglast ) *scratchp++ -= *diag-- * val;
				}
			}
		}
		res = sqrt(res);
	}
	if(residual) {
		this->Residual(result,F,*residual);
	}
	numiterations = it;
	tol = res;
}